

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# money.cpp
# Opt level: O0

void __thiscall Money::Money(Money *this,double money,string *currency)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_20;
  string *currency_local;
  double money_local;
  Money *this_local;
  
  local_20 = currency;
  currency_local = (string *)money;
  money_local = (double)this;
  std::__cxx11::string::string((string *)this,(string *)currency);
  this->cents = 0;
  bVar1 = is_money_valid((double)currency_local);
  if (!bVar1) {
    std::__cxx11::to_string(&local_90,(double)currency_local);
    std::operator+(&local_70,"Error in Money::Money() - \'",&local_90);
    std::operator+(&local_50,&local_70,"\' is not valid.");
    error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 3) goto LAB_00102dfb;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "Error in Money::Money() - Currency code must be provided according to ISO 4217.",
             &local_b1);
  error(&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
LAB_00102dfb:
  this->cents = (long)((double)currency_local * 100.0);
  return;
}

Assistant:

Money::Money(double money, const std::string& currency) : cents{ 0 }, currency{currency}
{
	if (!is_money_valid(money))
	{
		error("Error in Money::Money() - '" 
			+ std::to_string(money) + "' is not valid.");
	}
	if (currency.empty() || currency.size() != 3)
	{
		error("Error in Money::Money() - Currency code must be provided according to ISO 4217.");
	}
	cents = static_cast<long>(money * 100);
}